

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

bool __thiscall llvm::detail::IEEEFloat::convertFromStringSpecials(IEEEFloat *this,StringRef str)

{
  bool bVar1;
  long *plVar2;
  
  plVar2 = (long *)str.Data;
  switch(str.Length) {
  case 3:
    if (*(char *)((long)plVar2 + 2) != 'f' || (short)*plVar2 != 0x6e69) {
      if ((*(char *)((long)plVar2 + 2) != 'n' || (short)*plVar2 != 0x616e) &&
         (*(char *)((long)plVar2 + 2) != 'N' || (short)*plVar2 != 0x614e)) {
        return false;
      }
      bVar1 = false;
LAB_00171903:
      makeNaN(this,false,bVar1,(APInt *)0x0);
      return true;
    }
    break;
  case 4:
    if ((int)*plVar2 != 0x666e492b) {
      if (((int)*plVar2 != 0x666e692d) && ((int)*plVar2 != 0x666e492d)) {
        if (((int)*plVar2 != 0x6e616e2d) && ((int)*plVar2 != 0x4e614e2d)) {
          return false;
        }
        bVar1 = true;
        goto LAB_00171903;
      }
      goto LAB_0017192e;
    }
    break;
  default:
    return false;
  case 8:
    if (*plVar2 != 0x5954494e49464e49) {
      return false;
    }
    break;
  case 9:
    if ((char)plVar2[1] != 'Y' || *plVar2 != 0x54494e49464e492d) {
      return false;
    }
LAB_0017192e:
    bVar1 = true;
    goto LAB_00171933;
  }
  bVar1 = false;
LAB_00171933:
  makeInf(this,bVar1);
  return true;
}

Assistant:

bool IEEEFloat::convertFromStringSpecials(StringRef str) {
  if (str.equals("inf") || str.equals("INFINITY") || str.equals("+Inf")) {
    makeInf(false);
    return true;
  }

  if (str.equals("-inf") || str.equals("-INFINITY") || str.equals("-Inf")) {
    makeInf(true);
    return true;
  }

  if (str.equals("nan") || str.equals("NaN")) {
    makeNaN(false, false);
    return true;
  }

  if (str.equals("-nan") || str.equals("-NaN")) {
    makeNaN(false, true);
    return true;
  }

  return false;
}